

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

optional<pbrt::CameraRayDifferential> *
pbrt::detail::
Dispatch<pbrt::Camera::GenerateRayDifferential(pbrt::CameraSample,pbrt::SampledWavelengths&)const::__0&,pstd::optional<pbrt::CameraRayDifferential>,pbrt::PerspectiveCamera,pbrt::OrthographicCamera,pbrt::SphericalCamera,pbrt::RealisticCamera>
          (anon_class_16_2_908421f6 *func,void *ptr,int index)

{
  int in_ECX;
  optional<pbrt::CameraRayDifferential> *in_RDI;
  PerspectiveCamera *unaff_retaddr;
  anon_class_16_2_908421f6 *in_stack_00000008;
  
  if (in_ECX == 0) {
    const::$_0::operator()(in_stack_00000008,unaff_retaddr);
  }
  else if (in_ECX == 1) {
    const::$_0::operator()(in_stack_00000008,(OrthographicCamera *)unaff_retaddr);
  }
  else if (in_ECX == 2) {
    const::$_0::operator()(in_stack_00000008,(SphericalCamera *)unaff_retaddr);
  }
  else {
    const::$_0::operator()(in_stack_00000008,(RealisticCamera *)unaff_retaddr);
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU R Dispatch(F &&func, const void *ptr, int index) {
    DCHECK_GE(index, 0);
    DCHECK_LT(index, 4);

    switch (index) {
    case 0:
        return func((const T0 *)ptr);
    case 1:
        return func((const T1 *)ptr);
    case 2:
        return func((const T2 *)ptr);
    default:
        return func((const T3 *)ptr);
    }
}